

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_PerObjectMeshParameters *
ON_PerObjectMeshParameters::FindOrCreate(ON_Object *object,bool bCreate)

{
  bool bVar1;
  ON_PerObjectMeshParameters *this;
  ON_PerObjectMeshParameters *this_00;
  ON_UUID local_30;
  
  if (object == (ON_Object *)0x0) {
    this_00 = (ON_PerObjectMeshParameters *)0x0;
  }
  else {
    local_30 = ON_ClassId::Uuid(&m_ON_PerObjectMeshParameters_class_rtti);
    this = (ON_PerObjectMeshParameters *)ON_Object::GetUserData(object,&local_30);
    if (this == (ON_PerObjectMeshParameters *)0x0) {
      this_00 = (ON_PerObjectMeshParameters *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)this,&m_ON_PerObjectMeshParameters_class_rtti);
      this_00 = (ON_PerObjectMeshParameters *)0x0;
      if (bVar1) {
        this_00 = this;
      }
    }
    if (bCreate && this_00 == (ON_PerObjectMeshParameters *)0x0) {
      this_00 = (ON_PerObjectMeshParameters *)operator_new(0x1a8);
      ON_PerObjectMeshParameters(this_00);
      ON_Object::AttachUserData(object,(ON_UserData *)this_00);
    }
  }
  return this_00;
}

Assistant:

ON_PerObjectMeshParameters* ON_PerObjectMeshParameters::FindOrCreate(const ON_Object* object,bool bCreate)
{
  if ( 0 == object )
    return 0;
  ON_PerObjectMeshParameters* ud = ON_PerObjectMeshParameters::Cast(object->GetUserData(ON_CLASS_ID(ON_PerObjectMeshParameters)));
  if ( !ud && bCreate )
  {
    ud = new ON_PerObjectMeshParameters();
    const_cast< ON_Object* >(object)->AttachUserData(ud);
  }
  return ud;
}